

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O0

ProString * __thiscall QMakeProperty::value(QMakeProperty *this,ProKey *vk)

{
  bool bVar1;
  QAnyStringView *in_RSI;
  ProString *in_RDI;
  long in_FS_OFFSET;
  ProString val;
  ProString *in_stack_ffffffffffffff28;
  ProString *this_00;
  ProString *this_01;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined1 local_58 [48];
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  memset(local_58,0xaa,0x30);
  QHash<ProKey,_ProString>::value
            ((QHash<ProKey,_ProString> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),(ProKey *)in_RSI);
  bVar1 = ProString::isNull((ProString *)0x334841);
  if (bVar1) {
    initSettings((QMakeProperty *)this_01);
    this_00 = (ProString *)(in_RSI->field_0).m_data;
    ProString::toQString(this_00);
    QAnyStringView::QAnyStringView(in_RSI,&this_01->m_string);
    QSettings::value((QAnyStringView *)&local_28);
    QVariant::toString();
    ProString::ProString(in_RDI,&this_00->m_string);
    QString::~QString((QString *)0x3348de);
    QVariant::~QVariant(&local_28);
    QString::~QString((QString *)0x3348f5);
  }
  else {
    ProString::ProString(in_RDI,in_stack_ffffffffffffff28);
  }
  ProString::~ProString((ProString *)0x33490a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

ProString
QMakeProperty::value(const ProKey &vk)
{
    ProString val = m_values.value(vk);
    if (!val.isNull())
        return val;

    initSettings();
    return settings->value(vk.toQString()).toString();
}